

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::ReplaceInvalidOpcodePass::GetSpecialConstant
          (ReplaceInvalidOpcodePass *this,uint32_t type_id)

{
  ConstantManager *this_00;
  Analysis AVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  Type *type;
  Constant *c;
  uint uVar4;
  uint uVar5;
  IRContext *this_01;
  IRContext *pIVar6;
  uint32_t component_const;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literal_words;
  uint local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  TypeManager *local_38;
  
  pIVar6 = (this->super_Pass).context_;
  AVar1 = pIVar6->valid_analyses_;
  this_01 = pIVar6;
  if ((AVar1 >> 0xe & 1) == 0) {
    IRContext::BuildConstantManager(pIVar6);
    this_01 = (this->super_Pass).context_;
    AVar1 = this_01->valid_analyses_;
  }
  this_00 = (pIVar6->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  pIVar6 = this_01;
  if (-1 < (short)AVar1) {
    IRContext::BuildTypeManager(this_01);
    pIVar6 = (this->super_Pass).context_;
    AVar1 = pIVar6->valid_analyses_;
  }
  local_38 = (this_01->type_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar1 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar6);
  }
  pIVar3 = analysis::DefUseManager::GetDef
                     ((pIVar6->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,type_id);
  if (pIVar3->opcode_ - OpTypeInt < 2) {
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    uVar2 = (pIVar3->has_result_id_ & 1) + 1;
    if (pIVar3->has_type_id_ == false) {
      uVar2 = (uint)pIVar3->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(pIVar3,uVar2);
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        local_5c = 0xdeadbeef;
        if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_5c);
        }
        else {
          *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 0xdeadbeef;
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar5 = uVar5 + 0x20;
        uVar2 = (pIVar3->has_result_id_ & 1) + 1;
        if (pIVar3->has_type_id_ == false) {
          uVar2 = (uint)pIVar3->has_result_id_;
        }
        uVar2 = Instruction::GetSingleWordOperand(pIVar3,uVar2);
      } while (uVar5 < uVar2);
    }
  }
  else {
    if (pIVar3->opcode_ != OpTypeVector) {
      __assert_fail("type->opcode() == spv::Op::OpTypeInt || type->opcode() == spv::Op::OpTypeFloat"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_invalid_opc.cpp"
                    ,0xc5,
                    "uint32_t spvtools::opt::ReplaceInvalidOpcodePass::GetSpecialConstant(uint32_t)"
                   );
    }
    uVar2 = (pIVar3->has_result_id_ & 1) + 1;
    if (pIVar3->has_type_id_ == false) {
      uVar2 = (uint)pIVar3->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(pIVar3,uVar2);
    local_5c = GetSpecialConstant(this,uVar2);
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    uVar5 = (pIVar3->has_result_id_ & 1) + 1;
    if (pIVar3->has_type_id_ == false) {
      uVar5 = (uint)pIVar3->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(pIVar3,uVar5 + 1);
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
                     (iterator)
                     local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_5c);
        }
        else {
          *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_5c;
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar5 = uVar5 + 1;
        uVar4 = (pIVar3->has_result_id_ & 1) + 1;
        if (pIVar3->has_type_id_ == false) {
          uVar4 = (uint)pIVar3->has_result_id_;
        }
        uVar2 = Instruction::GetSingleWordOperand(pIVar3,uVar4 + 1);
      } while (uVar5 < uVar2);
    }
  }
  type = analysis::TypeManager::GetType(local_38,type_id);
  c = analysis::ConstantManager::GetConstant(this_00,type,&local_58);
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (c == (Constant *)0x0) {
    __assert_fail("special_const != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_invalid_opc.cpp"
                  ,0xcd,
                  "uint32_t spvtools::opt::ReplaceInvalidOpcodePass::GetSpecialConstant(uint32_t)");
  }
  uVar2 = 0;
  pIVar3 = analysis::ConstantManager::GetDefiningInstruction(this_00,c,0,(inst_iterator *)0x0);
  if (pIVar3->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
  }
  return uVar2;
}

Assistant:

uint32_t ReplaceInvalidOpcodePass::GetSpecialConstant(uint32_t type_id) {
  const analysis::Constant* special_const = nullptr;
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();

  Instruction* type = context()->get_def_use_mgr()->GetDef(type_id);
  if (type->opcode() == spv::Op::OpTypeVector) {
    uint32_t component_const =
        GetSpecialConstant(type->GetSingleWordInOperand(0));
    std::vector<uint32_t> ids;
    for (uint32_t i = 0; i < type->GetSingleWordInOperand(1); ++i) {
      ids.push_back(component_const);
    }
    special_const = const_mgr->GetConstant(type_mgr->GetType(type_id), ids);
  } else {
    assert(type->opcode() == spv::Op::OpTypeInt ||
           type->opcode() == spv::Op::OpTypeFloat);
    std::vector<uint32_t> literal_words;
    for (uint32_t i = 0; i < type->GetSingleWordInOperand(0); i += 32) {
      literal_words.push_back(0xDEADBEEF);
    }
    special_const =
        const_mgr->GetConstant(type_mgr->GetType(type_id), literal_words);
  }
  assert(special_const != nullptr);
  return const_mgr->GetDefiningInstruction(special_const)->result_id();
}